

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O1

ListBuilder * __thiscall
capnp::_::PointerBuilder::initStructList
          (ListBuilder *__return_storage_ptr__,PointerBuilder *this,ElementCount elementCount,
          StructSize elementSize)

{
  WirePointer *ref;
  SegmentBuilder *segment;
  BuilderArena *this_00;
  ulong uVar1;
  ulong uVar2;
  word *pwVar3;
  CapTableBuilder *capTable;
  ulong uVar4;
  uint uVar5;
  AllocateResult AVar6;
  anon_class_1_0_00000001 local_5b;
  anon_class_1_0_00000001 local_5a;
  anon_class_1_0_00000001 local_59;
  ulong local_58;
  CapTableBuilder *local_50;
  StructSize local_44;
  ulong local_40;
  ulong local_38;
  
  ref = this->pointer;
  segment = this->segment;
  AVar6.words = (word *)ref;
  AVar6.segment = segment;
  local_50 = this->capTable;
  uVar5 = (uint)elementSize >> 0x10;
  capTable = local_50;
  if (0x1fffffff < elementCount) {
    anon_func::anon_class_1_0_00000001::operator()(&local_5a);
    capTable = local_50;
  }
  local_38 = (ulong)((uint)elementSize & 0xffff);
  local_40 = (ulong)(((uint)elementSize & 0xffff) + uVar5);
  uVar4 = elementCount * local_40;
  local_58 = (ulong)uVar5;
  local_50 = (CapTableBuilder *)(ulong)elementCount;
  local_44 = elementSize;
  if (0x1ffffffe < uVar4) {
    WireHelpers::initStructListPointer::anon_class_1_0_00000001::operator()(&local_5b);
  }
  if ((ref->field_1).upper32Bits != 0 || (ref->offsetAndKind).value != 0) {
    WireHelpers::zeroObject(segment,capTable,ref);
  }
  uVar1 = local_58;
  pwVar3 = segment->pos;
  uVar2 = uVar4 + 1 & 0xffffffff;
  if ((long)((long)(segment->super_SegmentReader).ptr.ptr +
            ((segment->super_SegmentReader).ptr.size_ * 8 - (long)pwVar3)) >> 3 < (long)uVar2) {
    pwVar3 = (word *)0x0;
  }
  else {
    segment->pos = pwVar3 + uVar2;
  }
  if (pwVar3 == (word *)0x0) {
    uVar5 = (int)uVar4 + 2;
    this_00 = (BuilderArena *)(segment->super_SegmentReader).arena;
    if (0x1fffffff < uVar5) {
      local_58 = CONCAT44(local_58._4_4_,uVar5);
      WireHelpers::allocate::anon_class_1_0_00000001::operator()(&local_59);
      uVar5 = (SegmentWordCount)local_58;
    }
    AVar6 = BuilderArena::allocate(this_00,uVar5);
    (ref->offsetAndKind).value =
         (int)AVar6.words - *(int *)&((AVar6.segment)->super_SegmentReader).ptr.ptr & 0xfffffff8U |
         2;
    ref->field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)
                   ((AVar6.segment)->super_SegmentReader).id.value;
    *(undefined4 *)&(AVar6.words)->content = 1;
    pwVar3 = AVar6.words + 1;
  }
  else {
    (ref->offsetAndKind).value = ((uint)((ulong)((long)pwVar3 - (long)ref) >> 1) & 0xfffffffc) - 3;
  }
  *(int *)((long)&(AVar6.words)->content + 4) = (int)uVar4 * 8 + 7;
  *(ListElementCount *)&pwVar3->content = (ListElementCount)local_50 * 4;
  *(StructDataWordCount *)((long)&pwVar3->content + 4) = local_44.data;
  *(StructPointerCount *)((long)&pwVar3->content + 6) = (StructPointerCount)uVar1;
  __return_storage_ptr__->segment = AVar6.segment;
  __return_storage_ptr__->capTable = capTable;
  __return_storage_ptr__->ptr = (byte *)(pwVar3 + 1);
  __return_storage_ptr__->elementCount = (ListElementCount)local_50;
  __return_storage_ptr__->step = (int)local_40 << 6;
  __return_storage_ptr__->structDataSize = (int)local_38 << 6;
  __return_storage_ptr__->structPointerCount = (StructPointerCount)uVar1;
  __return_storage_ptr__->elementSize = INLINE_COMPOSITE;
  return __return_storage_ptr__;
}

Assistant:

ListBuilder PointerBuilder::initStructList(ElementCount elementCount, StructSize elementSize) {
  return WireHelpers::initStructListPointer(pointer, segment, capTable, elementCount, elementSize);
}